

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int accessPayload(BtCursor *pCur,u32 offset,u32 amt,uchar *pBuf,int eOp)

{
  ushort uVar1;
  MemPage *pPage;
  u8 *puVar2;
  ulong uVar3;
  uchar *puVar4;
  DbPage *pDbPage_00;
  int iVar5;
  u32 ovfl;
  uint uVar6;
  Pgno *pOld;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  BtShared *pBt;
  undefined4 in_register_00000084;
  ulong uVar10;
  BtCursor *pBVar11;
  u32 uVar12;
  uint uVar13;
  int nByte;
  Pgno nextPage;
  uint local_6c;
  BtShared *local_68;
  ulong local_60;
  BtCursor *local_58;
  uchar *local_50;
  uint local_44;
  ulong local_40;
  DbPage *pDbPage;
  
  local_60 = CONCAT44(in_register_00000084,eOp);
  uVar10 = (ulong)amt;
  pPage = pCur->apPage[pCur->iPage];
  local_68 = pCur->pBt;
  if ((pCur->info).nSize == 0) {
    btreeParseCell(pPage,(uint)pCur->aiIdx[pCur->iPage],&pCur->info);
    pCur->curFlags = pCur->curFlags | 2;
  }
  puVar2 = (pCur->info).pPayload;
  uVar1 = (pCur->info).nLocal;
  iVar5 = 0xdf72;
  local_58 = pCur;
  if (pPage->aData + local_68->usableSize < puVar2 + uVar1) goto LAB_0012369b;
  uVar6 = (uint)uVar1;
  if (uVar6 < offset || uVar6 - offset == 0) {
    uVar9 = (ulong)(offset - uVar6);
    iVar5 = 0;
  }
  else {
    uVar12 = uVar6 - offset;
    if (amt + offset <= (uint)uVar1) {
      uVar12 = amt;
    }
    iVar5 = copyPayload(puVar2 + offset,pBuf,uVar12,(uint)local_60 & 1,pPage->pDbPage);
    pBuf = pBuf + (int)uVar12;
    uVar10 = (ulong)(amt - uVar12);
    uVar9 = 0;
  }
  pBVar11 = local_58;
  if ((iVar5 == 0) && ((int)uVar10 != 0)) {
    uVar12 = local_68->usableSize;
    local_6c = uVar12 - 4;
    uVar1 = (local_58->info).nLocal;
    local_50 = pBuf;
    ovfl = sqlite3Get4byte(puVar2 + uVar1);
    iVar5 = 0;
    nextPage = ovfl;
    if (((int)local_60 != 2) && ((pBVar11->curFlags & 4) == 0)) {
      uVar6 = (((pBVar11->info).nPayload + (uVar12 - uVar1)) - 5) / local_6c;
      pOld = pBVar11->aOverflow;
      if (pBVar11->nOvflAlloc < (int)uVar6) {
        pOld = (Pgno *)sqlite3Realloc(pOld,(long)(int)(uVar6 * 2) << 2);
        if (pOld == (Pgno *)0x0) {
          iVar5 = 7;
          goto LAB_00123521;
        }
        pBVar11->nOvflAlloc = uVar6 * 2;
        pBVar11->aOverflow = pOld;
      }
      memset(pOld,0,(long)(int)uVar6 << 2);
      pBVar11->curFlags = pBVar11->curFlags | 4;
      iVar5 = 0;
    }
LAB_00123521:
    if ((pBVar11->curFlags & 4) == 0) {
      lVar7 = 0;
    }
    else {
      uVar3 = uVar9 / local_6c;
      lVar7 = 0;
      if (pBVar11->aOverflow[uVar3] != 0) {
        lVar7 = (long)(int)uVar3;
        ovfl = pBVar11->aOverflow[lVar7];
        uVar9 = uVar9 % (ulong)local_6c;
        nextPage = ovfl;
      }
    }
    uVar6 = (uint)local_60 & 1;
    local_60 = (ulong)uVar6;
    local_44 = uVar6 * 2 ^ 2;
    lVar7 = lVar7 << 2;
    pBt = local_68;
    uVar6 = local_6c;
    while (((uVar8 = (uint)uVar9, iVar5 == 0 && ((int)uVar10 != 0)) && (ovfl != 0))) {
      if ((pBVar11->curFlags & 4) != 0) {
        *(u32 *)((long)pBVar11->aOverflow + lVar7) = ovfl;
      }
      uVar13 = uVar8 - uVar6;
      if (uVar8 < uVar6) {
        uVar9 = (ulong)(uVar6 - uVar8);
        if ((int)uVar10 + uVar8 <= uVar6) {
          uVar9 = uVar10;
        }
        iVar5 = sqlite3PagerAcquire(pBt->pPager,ovfl,&pDbPage,local_44);
        pDbPage_00 = pDbPage;
        nByte = (int)uVar9;
        uVar13 = uVar8;
        if (iVar5 == 0) {
          puVar2 = (u8 *)pDbPage->pData;
          local_40 = uVar10;
          ovfl = sqlite3Get4byte(puVar2);
          puVar4 = local_50;
          nextPage = ovfl;
          iVar5 = copyPayload(puVar2 + (uVar8 + 4),local_50,nByte,(int)local_60,pDbPage_00);
          uVar10 = local_40;
          sqlite3PagerUnref(pDbPage_00);
          local_50 = puVar4;
          uVar13 = 0;
        }
        uVar10 = (ulong)(uint)((int)uVar10 - nByte);
        local_50 = local_50 + nByte;
        pBt = local_68;
        pBVar11 = local_58;
        uVar6 = local_6c;
      }
      else {
        uVar12 = *(u32 *)((long)pBVar11->aOverflow + lVar7 + 4);
        if (uVar12 == 0) {
          iVar5 = getOverflowPage(pBt,ovfl,(MemPage **)0x0,&nextPage);
          pBt = local_68;
          ovfl = nextPage;
          uVar6 = local_6c;
        }
        else {
          iVar5 = 0;
          ovfl = uVar12;
          nextPage = uVar12;
        }
      }
      lVar7 = lVar7 + 4;
      uVar9 = (ulong)uVar13;
    }
  }
  if (iVar5 != 0) {
    return iVar5;
  }
  iVar5 = 0xe00d;
  if ((int)uVar10 == 0) {
    return 0;
  }
LAB_0012369b:
  sqlite3CorruptError(iVar5);
  return 0xb;
}

Assistant:

static int accessPayload(
  BtCursor *pCur,      /* Cursor pointing to entry to read from */
  u32 offset,          /* Begin reading this far into payload */
  u32 amt,             /* Read this many bytes */
  unsigned char *pBuf, /* Write the bytes into this buffer */ 
  int eOp              /* zero to read. non-zero to write. */
){
  unsigned char *aPayload;
  int rc = SQLITE_OK;
  int iIdx = 0;
  MemPage *pPage = pCur->apPage[pCur->iPage]; /* Btree page of current entry */
  BtShared *pBt = pCur->pBt;                  /* Btree this cursor belongs to */
#ifdef SQLITE_DIRECT_OVERFLOW_READ
  unsigned char * const pBufStart = pBuf;
  int bEnd;                                 /* True if reading to end of data */
#endif

  assert( pPage );
  assert( pCur->eState==CURSOR_VALID );
  assert( pCur->aiIdx[pCur->iPage]<pPage->nCell );
  assert( cursorHoldsMutex(pCur) );
  assert( eOp!=2 || offset==0 );    /* Always start from beginning for eOp==2 */

  getCellInfo(pCur);
  aPayload = pCur->info.pPayload;
#ifdef SQLITE_DIRECT_OVERFLOW_READ
  bEnd = offset+amt==pCur->info.nPayload;
#endif
  assert( offset+amt <= pCur->info.nPayload );

  if( &aPayload[pCur->info.nLocal] > &pPage->aData[pBt->usableSize] ){
    /* Trying to read or write past the end of the data is an error */
    return SQLITE_CORRUPT_BKPT;
  }

  /* Check if data must be read/written to/from the btree page itself. */
  if( offset<pCur->info.nLocal ){
    int a = amt;
    if( a+offset>pCur->info.nLocal ){
      a = pCur->info.nLocal - offset;
    }
    rc = copyPayload(&aPayload[offset], pBuf, a, (eOp & 0x01), pPage->pDbPage);
    offset = 0;
    pBuf += a;
    amt -= a;
  }else{
    offset -= pCur->info.nLocal;
  }


  if( rc==SQLITE_OK && amt>0 ){
    const u32 ovflSize = pBt->usableSize - 4;  /* Bytes content per ovfl page */
    Pgno nextPage;

    nextPage = get4byte(&aPayload[pCur->info.nLocal]);

    /* If the BtCursor.aOverflow[] has not been allocated, allocate it now.
    ** Except, do not allocate aOverflow[] for eOp==2.
    **
    ** The aOverflow[] array is sized at one entry for each overflow page
    ** in the overflow chain. The page number of the first overflow page is
    ** stored in aOverflow[0], etc. A value of 0 in the aOverflow[] array
    ** means "not yet known" (the cache is lazily populated).
    */
    if( eOp!=2 && (pCur->curFlags & BTCF_ValidOvfl)==0 ){
      int nOvfl = (pCur->info.nPayload-pCur->info.nLocal+ovflSize-1)/ovflSize;
      if( nOvfl>pCur->nOvflAlloc ){
        Pgno *aNew = (Pgno*)sqlite3Realloc(
            pCur->aOverflow, nOvfl*2*sizeof(Pgno)
        );
        if( aNew==0 ){
          rc = SQLITE_NOMEM;
        }else{
          pCur->nOvflAlloc = nOvfl*2;
          pCur->aOverflow = aNew;
        }
      }
      if( rc==SQLITE_OK ){
        memset(pCur->aOverflow, 0, nOvfl*sizeof(Pgno));
        pCur->curFlags |= BTCF_ValidOvfl;
      }
    }

    /* If the overflow page-list cache has been allocated and the
    ** entry for the first required overflow page is valid, skip
    ** directly to it.
    */
    if( (pCur->curFlags & BTCF_ValidOvfl)!=0
     && pCur->aOverflow[offset/ovflSize]
    ){
      iIdx = (offset/ovflSize);
      nextPage = pCur->aOverflow[iIdx];
      offset = (offset%ovflSize);
    }

    for( ; rc==SQLITE_OK && amt>0 && nextPage; iIdx++){

      /* If required, populate the overflow page-list cache. */
      if( (pCur->curFlags & BTCF_ValidOvfl)!=0 ){
        assert(!pCur->aOverflow[iIdx] || pCur->aOverflow[iIdx]==nextPage);
        pCur->aOverflow[iIdx] = nextPage;
      }

      if( offset>=ovflSize ){
        /* The only reason to read this page is to obtain the page
        ** number for the next page in the overflow chain. The page
        ** data is not required. So first try to lookup the overflow
        ** page-list cache, if any, then fall back to the getOverflowPage()
        ** function.
        **
        ** Note that the aOverflow[] array must be allocated because eOp!=2
        ** here.  If eOp==2, then offset==0 and this branch is never taken.
        */
        assert( eOp!=2 );
        assert( pCur->curFlags & BTCF_ValidOvfl );
        assert( pCur->pBtree->db==pBt->db );
        if( pCur->aOverflow[iIdx+1] ){
          nextPage = pCur->aOverflow[iIdx+1];
        }else{
          rc = getOverflowPage(pBt, nextPage, 0, &nextPage);
        }
        offset -= ovflSize;
      }else{
        /* Need to read this page properly. It contains some of the
        ** range of data that is being read (eOp==0) or written (eOp!=0).
        */
#ifdef SQLITE_DIRECT_OVERFLOW_READ
        sqlite3_file *fd;
#endif
        int a = amt;
        if( a + offset > ovflSize ){
          a = ovflSize - offset;
        }

#ifdef SQLITE_DIRECT_OVERFLOW_READ
        /* If all the following are true:
        **
        **   1) this is a read operation, and 
        **   2) data is required from the start of this overflow page, and
        **   3) the database is file-backed, and
        **   4) there is no open write-transaction, and
        **   5) the database is not a WAL database,
        **   6) all data from the page is being read.
        **   7) at least 4 bytes have already been read into the output buffer 
        **
        ** then data can be read directly from the database file into the
        ** output buffer, bypassing the page-cache altogether. This speeds
        ** up loading large records that span many overflow pages.
        */
        if( (eOp&0x01)==0                                      /* (1) */
         && offset==0                                          /* (2) */
         && (bEnd || a==ovflSize)                              /* (6) */
         && pBt->inTransaction==TRANS_READ                     /* (4) */
         && (fd = sqlite3PagerFile(pBt->pPager))->pMethods     /* (3) */
         && pBt->pPage1->aData[19]==0x01                       /* (5) */
         && &pBuf[-4]>=pBufStart                               /* (7) */
        ){
          u8 aSave[4];
          u8 *aWrite = &pBuf[-4];
          assert( aWrite>=pBufStart );                         /* hence (7) */
          memcpy(aSave, aWrite, 4);
          rc = sqlite3OsRead(fd, aWrite, a+4, (i64)pBt->pageSize*(nextPage-1));
          nextPage = get4byte(aWrite);
          memcpy(aWrite, aSave, 4);
        }else
#endif

        {
          DbPage *pDbPage;
          rc = sqlite3PagerAcquire(pBt->pPager, nextPage, &pDbPage,
              ((eOp&0x01)==0 ? PAGER_GET_READONLY : 0)
          );
          if( rc==SQLITE_OK ){
            aPayload = sqlite3PagerGetData(pDbPage);
            nextPage = get4byte(aPayload);
            rc = copyPayload(&aPayload[offset+4], pBuf, a, (eOp&0x01), pDbPage);
            sqlite3PagerUnref(pDbPage);
            offset = 0;
          }
        }
        amt -= a;
        pBuf += a;
      }
    }
  }

  if( rc==SQLITE_OK && amt>0 ){
    return SQLITE_CORRUPT_BKPT;
  }
  return rc;
}